

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_tests.cpp
# Opt level: O1

void __thiscall validation_tests::signet_parse_tests::test_method(signet_parse_tests *this)

{
  pointer __s1;
  pointer puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined1 auVar3 [8];
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar7;
  CScript *pCVar8;
  undefined8 uVar9;
  CMutableTransaction *pCVar10;
  size_t __n;
  iterator in_R8;
  iterator pvVar11;
  iterator in_R9;
  iterator pvVar12;
  long in_FS_OFFSET;
  readonly_property<bool> rVar13;
  const_string file;
  initializer_list<unsigned_char> __l;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  initializer_list<unsigned_char> __l_00;
  const_string file_04;
  const_string file_05;
  initializer_list<unsigned_char> __l_01;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  vector<unsigned_char,_std::allocator<unsigned_char>_> witness_commitment_section_325;
  CMutableTransaction cb;
  unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> signet_params;
  vector<unsigned_char,_std::allocator<unsigned_char>_> witness_commitment_section_141;
  CScript challenge;
  CBlock block;
  ArgsManager signet_argsman;
  check_type cVar14;
  undefined1 *local_7a0;
  undefined1 *local_798;
  char *local_790;
  char *local_788;
  char *local_780;
  char *local_778;
  undefined1 *local_770;
  undefined1 *local_768;
  char *local_760;
  char *local_758;
  char *local_750;
  char *local_748;
  undefined1 *local_740;
  undefined1 *local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  char *local_718;
  undefined1 *local_710;
  undefined1 *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  char *local_6e8;
  undefined1 *local_6e0;
  undefined1 *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  char *local_6b8;
  undefined1 *local_6b0;
  undefined1 *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  char *local_688;
  undefined1 *local_680;
  undefined1 *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  char *local_658;
  char *local_650;
  char *local_648;
  shared_count local_640;
  element_type *local_638;
  shared_count sStack_630;
  undefined1 *local_628;
  undefined1 *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  assertion_result local_5c8;
  undefined1 *local_5b0;
  undefined1 *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  undefined1 *local_580;
  undefined1 *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  assertion_result local_550;
  allocator_type *local_538;
  undefined1 *local_530;
  undefined1 *local_528;
  char *local_520;
  char *local_518;
  undefined1 local_510 [24];
  vector<CTxOut,_std::allocator<CTxOut>_> local_4f8;
  char *local_4d8;
  char *local_4d0;
  undefined1 *local_4c8;
  undefined1 *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  undefined1 *local_498;
  undefined1 *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  undefined1 local_448 [8];
  undefined1 local_440 [24];
  undefined1 local_428 [16];
  CTxIn local_418 [2];
  readonly_property65 local_328;
  direct_or_indirect local_318;
  uint local_2fc;
  undefined1 local_2f8 [32];
  _Base_ptr local_2d8;
  size_t sStack_2d0;
  uchar local_2c8 [8];
  _List_node_base *p_Stack_2c0;
  _List_node_base *local_2b8;
  size_t sStack_2b0;
  _Storage<fs::path,_false> local_2a8;
  ArgsManager local_280;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::ArgsManager(&local_280);
  local_428._0_8_ = local_418;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"-signetchallenge","");
  local_2f8._0_8_ = local_2f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"51","");
  ArgsManager::ForceSetArg(&local_280,(string *)local_428,(string *)local_2f8);
  if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
    operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
  }
  if ((CTxIn *)local_428._0_8_ != local_418) {
    operator_delete((void *)local_428._0_8_,
                    local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_
                    + 1);
  }
  CreateChainParams((ArgsManager *)local_448,(ChainType)&local_280);
  local_2a8._16_8_ = 0;
  local_2a8._M_value.super_path._M_pathname._M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
  sStack_2b0 = 0;
  local_2b8 = (_List_node_base *)0x0;
  p_Stack_2c0 = (_List_node_base *)0x0;
  local_2c8[0] = '\0';
  local_2c8[1] = '\0';
  local_2c8[2] = '\0';
  local_2c8[3] = '\0';
  local_2c8[4] = '\0';
  local_2c8[5] = '\0';
  local_2c8[6] = '\0';
  local_2c8[7] = '\0';
  sStack_2d0 = 0;
  local_2d8 = (_Base_ptr)0x0;
  local_2f8._24_8_ = 0;
  local_2f8._16_8_ = 0;
  local_2f8._8_8_ = 0;
  local_2f8._0_8_ = (pointer)0x0;
  local_2a8._M_value.super_path._M_pathname._M_string_length = 0;
  local_2a8._24_3_ = 0;
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_450 = "";
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x4b;
  file.m_begin = (iterator)&local_458;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_468,msg);
  auVar3 = local_448;
  local_440[0] = 0x51;
  __l._M_len = 1;
  __l._M_array = (iterator)local_440;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_318.indirect_contents,
             __l,(allocator_type *)&local_5c8);
  __s1 = (((vector<unsigned_char,_std::allocator<unsigned_char>_> *)((long)auVar3 + 0x158))->
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start;
  puVar1 = *(pointer *)((long)auVar3 + 0x160);
  __n = (long)puVar1 - (long)__s1;
  if (__n == local_318._8_8_ - local_318._0_8_) {
    if (puVar1 == __s1) {
      rVar13.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar6 = bcmp(__s1,local_318.indirect_contents.indirect,__n);
      rVar13.super_class_property<bool>.value = (class_property<bool>)(iVar6 == 0);
    }
  }
  else {
    rVar13.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_510[0] = rVar13.super_class_property<bool>.value;
  local_510._8_8_ = (element_type *)0x0;
  local_510._16_8_ = (sp_counted_base *)0x0;
  local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ = &local_550;
  local_550._0_8_ =
       "signet_params->GetConsensus().signet_challenge == std::vector<uint8_t>{OP_TRUE}";
  local_550.m_message.px = (element_type *)0xfa5192;
  local_428._8_8_ = local_428._8_8_ & 0xffffffffffffff00;
  local_428._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_478 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_470 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_510,(lazy_ostream *)local_428,1,0,WARN,_cVar14,
             (size_t)&local_478,0x4b);
  boost::detail::shared_count::~shared_count((shared_count *)(local_510 + 0x10));
  if ((_Base_ptr)local_318.indirect_contents.indirect != (_Base_ptr)0x0) {
    operator_delete(local_318.indirect_contents.indirect,local_318._16_8_ - local_318._0_8_);
  }
  CScript::CScript((CScript *)&local_318.indirect_contents,OP_1);
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_480 = "";
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x4f;
  file_00.m_begin = (iterator)&local_488;
  msg_00.m_end = pvVar12;
  msg_00.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_498,
             msg_00);
  SignetTxs::Create((optional<SignetTxs> *)local_428,(CBlock *)local_2f8,
                    (CScript *)&local_318.indirect_contents);
  local_550._0_8_ =
       CONCAT71(local_550._1_7_,
                local_328.super_readonly_property<bool>.super_class_property<bool>.value) ^ 1;
  local_550.m_message.px = (element_type *)0x0;
  local_550.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_440._0_8_ = "!SignetTxs::Create(block, challenge)";
  local_440._8_8_ = (long)"!SignetTxs::Create(block, challenge)" + 0x24;
  local_510._8_8_ = local_510._8_8_ & 0xffffffffffffff00;
  local_510._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_510._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_4a0 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  local_4f8.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_440;
  boost::test_tools::tt_detail::report_assertion
            (&local_550,(lazy_ostream *)local_510,1,0,WARN,_cVar14,(size_t)&local_4a8,0x4f);
  boost::detail::shared_count::~shared_count(&local_550.m_message.pn);
  if (local_328.super_readonly_property<bool>.super_class_property<bool>.value ==
      (class_property<bool>)0x1) {
    std::_Optional_payload_base<SignetTxs>::_M_destroy
              ((_Optional_payload_base<SignetTxs> *)local_428);
  }
  local_4b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_4b0 = "";
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = &DAT_00000050;
  file_01.m_begin = (iterator)&local_4b8;
  msg_01.m_end = pvVar12;
  msg_01.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_4c8,
             msg_01);
  bVar5 = CheckSignetBlockSolution((CBlock *)local_2f8,(Params *)local_448);
  local_510[0] = !bVar5;
  local_510._8_8_ = (element_type *)0x0;
  local_510._16_8_ = (sp_counted_base *)0x0;
  local_550._0_8_ = "!CheckSignetBlockSolution(block, signet_params->GetConsensus())";
  local_550.m_message.px = (element_type *)0xfa51f7;
  local_428._8_8_ = local_428._8_8_ & 0xffffffffffffff00;
  local_428._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_4d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_4d0 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ = &local_550;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_510,(lazy_ostream *)local_428,1,0,WARN,_cVar14,
             (size_t)&local_4d8,0x50);
  boost::detail::shared_count::~shared_count((shared_count *)(local_510 + 0x10));
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)local_510);
  local_550._0_8_ = local_550._0_8_ & 0xffffffff00000000;
  local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_428._0_8_ = (pointer)0x0;
  local_428._8_8_ = (pointer)0x0;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<int,CScript>
            ((vector<CTxOut,std::allocator<CTxOut>> *)&local_4f8,(int *)&local_550,
             (CScript *)local_428);
  if (0x1c < (uint)local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._12_4_)
  {
    free((void *)local_428._0_8_);
  }
  local_428._0_8_ = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_428 + 8),
             (CTransaction **)local_428,(allocator<CTransaction> *)&local_550,
             (CMutableTransaction *)local_510);
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>>
            ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
              *)&local_2a8._M_value,(shared_ptr<const_CTransaction> *)local_428);
  if ((pointer)local_428._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428._8_8_);
  }
  local_428._0_8_ = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_428 + 8),
             (CTransaction **)local_428,(allocator<CTransaction> *)&local_550,
             (CMutableTransaction *)local_510);
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>>
            ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
              *)&local_2a8._M_value,(shared_ptr<const_CTransaction> *)local_428);
  if ((pointer)local_428._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428._8_8_);
  }
  local_520 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_518 = "";
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x57;
  file_02.m_begin = (iterator)&local_520;
  msg_02.m_end = pvVar12;
  msg_02.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_530,
             msg_02);
  SignetTxs::Create((optional<SignetTxs> *)local_428,(CBlock *)local_2f8,
                    (CScript *)&local_318.indirect_contents);
  local_440._0_8_ =
       CONCAT71(local_440._1_7_,
                local_328.super_readonly_property<bool>.super_class_property<bool>.value) ^ 1;
  local_440._8_8_ = 0;
  local_440._16_8_ = (__pthread_internal_list *)0x0;
  local_5c8._0_8_ = "!SignetTxs::Create(block, challenge)";
  local_5c8.m_message.px = (element_type *)0xfa51b7;
  local_550.m_message.px = (element_type *)((ulong)local_550.m_message.px & 0xffffffffffffff00);
  local_550._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_550.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_560 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_558 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  local_538 = (allocator_type *)&local_5c8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_440,(lazy_ostream *)&local_550,1,0,WARN,_cVar14,
             (size_t)&local_560,0x57);
  boost::detail::shared_count::~shared_count((shared_count *)(local_440 + 0x10));
  if (local_328.super_readonly_property<bool>.super_class_property<bool>.value ==
      (class_property<bool>)0x1) {
    std::_Optional_payload_base<SignetTxs>::_M_destroy
              ((_Optional_payload_base<SignetTxs> *)local_428);
  }
  local_570 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_568 = "";
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = &DAT_00000058;
  file_03.m_begin = (iterator)&local_570;
  msg_03.m_end = pvVar12;
  msg_03.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_580,
             msg_03);
  bVar5 = CheckSignetBlockSolution((CBlock *)local_2f8,(Params *)local_448);
  local_550.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar5;
  local_550.m_message.px = (element_type *)0x0;
  local_550.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_440._0_8_ = "!CheckSignetBlockSolution(block, signet_params->GetConsensus())";
  local_440._8_8_ = (long)"!CheckSignetBlockSolution(block, signet_params->GetConsensus())" + 0x3f;
  local_428._8_8_ = local_428._8_8_ & 0xffffffffffffff00;
  local_428._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_590 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_588 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (assertion_result *)local_440;
  boost::test_tools::tt_detail::report_assertion
            (&local_550,(lazy_ostream *)local_428,1,0,WARN,_cVar14,(size_t)&local_590,0x58);
  boost::detail::shared_count::~shared_count(&local_550.m_message.pn);
  local_428._0_4_ = 0xeda921aa;
  __l_00._M_len = 4;
  __l_00._M_array = local_428;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_440,__l_00,
             (allocator_type *)&local_550);
  iVar6 = 0x20;
  do {
    local_428[0] = 0xff;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_440,(uchar *)local_428
              );
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
       (undefined1 *)0x0;
  local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (assertion_result *)0x0;
  local_428._0_8_ = (pointer)0x0;
  local_428._8_8_ = (pointer)0x0;
  local_550.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x6a;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_428,(iterator)local_428,
             (uchar *)&local_550);
  ppVar7 = &CScript::operator<<((CScript *)local_428,
                                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_440)
            ->super_CScriptBase;
  if (local_4f8.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_4f8.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0078b127;
    pCVar10 = (CMutableTransaction *)0x0;
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_0078aa53:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0078b127;
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_0078aa7c:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0078b127;
    pCVar10 = (CMutableTransaction *)((long)pCVar10 >> 3);
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
               (long)pCVar10 * -0x3333333333333333);
LAB_0078aab5:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0078b127;
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_0078aade:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0078b127;
    pCVar10 = (CMutableTransaction *)((long)pCVar10 >> 3);
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
               (long)pCVar10 * -0x3333333333333333);
LAB_0078ab17:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0078b127;
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_0078ab40:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0078b127;
    pCVar10 = (CMutableTransaction *)((long)pCVar10 >> 3);
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
               (long)pCVar10 * -0x3333333333333333);
LAB_0078ab79:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0078b127;
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_0078aba2:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0078b127;
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
               ((long)pCVar10 >> 3) * -0x3333333333333333);
  }
  else {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&((local_4f8.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar7);
    if (0x1c < (uint)local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems.
                     _12_4_) {
      free((void *)local_428._0_8_);
    }
    local_428._0_8_ = (pointer)0x0;
    pCVar10 = (CMutableTransaction *)local_510;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_428 + 8),
               (CTransaction **)local_428,(allocator<CTransaction> *)&local_550,pCVar10);
    uVar4 = local_428._8_8_;
    uVar9 = local_428._0_8_;
    if ((_Alloc_hider)local_2a8._M_value.super_path._M_pathname._M_string_length ==
        local_2a8._M_value.super_path._M_pathname._M_dataplus._M_p) goto LAB_0078aa53;
    local_428._0_8_ = (pointer)0x0;
    local_428._8_8_ = (pointer)0x0;
    p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)local_2a8._M_value.super_path._M_pathname._M_dataplus._M_p + 8);
    *(undefined8 *)local_2a8._M_value.super_path._M_pathname._M_dataplus._M_p = uVar9;
    *(undefined8 *)((long)local_2a8._M_value.super_path._M_pathname._M_dataplus._M_p + 8) = uVar4;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if ((pointer)local_428._8_8_ != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428._8_8_);
    }
    local_5a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_598 = "";
    local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_04.m_end = (iterator)0x61;
    file_04.m_begin = (iterator)&local_5a0;
    msg_04.m_end = pvVar12;
    msg_04.m_begin = pvVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_5b0,
               msg_04);
    SignetTxs::Create((optional<SignetTxs> *)local_428,(CBlock *)local_2f8,
                      (CScript *)&local_318.indirect_contents);
    local_5c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         local_328.super_readonly_property<bool>.super_class_property<bool>.value;
    local_5c8.m_message.px = (element_type *)0x0;
    local_5c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_538 = (allocator_type *)&local_640;
    local_640.pi_ = (sp_counted_base *)0xfa5194;
    local_638 = (element_type *)0xfa51b7;
    local_550.m_message.px = (element_type *)((ulong)local_550.m_message.px & 0xffffffffffffff00);
    local_550._0_8_ = &PTR__lazy_ostream_013d3df0;
    local_550.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_5d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_5d0 = "";
    pvVar11 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_5c8,(lazy_ostream *)&local_550,1,0,WARN,_cVar14,(size_t)&local_5d8,0x61);
    boost::detail::shared_count::~shared_count(&local_5c8.m_message.pn);
    if (local_328.super_readonly_property<bool>.super_class_property<bool>.value ==
        (class_property<bool>)0x1) {
      std::_Optional_payload_base<SignetTxs>::_M_destroy
                ((_Optional_payload_base<SignetTxs> *)local_428);
    }
    local_5e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_5e0 = "";
    local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_05.m_end = (iterator)0x62;
    file_05.m_begin = (iterator)&local_5e8;
    msg_05.m_end = pvVar12;
    msg_05.m_begin = pvVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_5f8,
               msg_05);
    rVar13.super_class_property<bool>.value =
         (class_property<bool>)CheckSignetBlockSolution((CBlock *)local_2f8,(Params *)local_448);
    local_550.m_message.px = (element_type *)0x0;
    local_550.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_5c8._0_8_ = "CheckSignetBlockSolution(block, signet_params->GetConsensus())";
    local_5c8.m_message.px = (element_type *)0xfa51f7;
    local_428._8_8_ = local_428._8_8_ & 0xffffffffffffff00;
    local_428._0_8_ = &PTR__lazy_ostream_013d3df0;
    local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
         boost::unit_test::lazy_ostream::inst;
    local_608 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_600 = "";
    pvVar11 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ = &local_5c8;
    local_550.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)rVar13.super_class_property<bool>.value;
    boost::test_tools::tt_detail::report_assertion
              (&local_550,(lazy_ostream *)local_428,1,0,WARN,_cVar14,(size_t)&local_608,0x62);
    boost::detail::shared_count::~shared_count(&local_550.m_message.pn);
    local_428._0_4_ = 0xa2dac7ec;
    __l_01._M_len = 4;
    __l_01._M_array = (iterator)local_428;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_5c8,__l_01,
               (allocator_type *)&local_550);
    local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
         (undefined1 *)0x0;
    local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
         (assertion_result *)0x0;
    local_428._0_8_ = (pointer)0x0;
    local_428._8_8_ = (pointer)0x0;
    local_550.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)0x6a;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_428,(iterator)local_428,
               (uchar *)&local_550);
    pCVar8 = CScript::operator<<((CScript *)local_428,
                                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_440)
    ;
    ppVar7 = &CScript::operator<<(pCVar8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &local_5c8)->super_CScriptBase;
    pCVar10 = (CMutableTransaction *)
              ((long)local_4f8.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)local_4f8.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data._M_start);
    if (pCVar10 == (CMutableTransaction *)0x0) goto LAB_0078aa7c;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&((local_4f8.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar7);
    if (0x1c < (uint)local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems.
                     _12_4_) {
      free((void *)local_428._0_8_);
    }
    local_428._0_8_ = (pointer)0x0;
    pCVar10 = (CMutableTransaction *)local_510;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_428 + 8),
               (CTransaction **)local_428,(allocator<CTransaction> *)&local_550,pCVar10);
    uVar4 = local_428._8_8_;
    uVar9 = local_428._0_8_;
    if ((_Alloc_hider)local_2a8._M_value.super_path._M_pathname._M_string_length ==
        local_2a8._M_value.super_path._M_pathname._M_dataplus._M_p) goto LAB_0078aab5;
    local_428._0_8_ = (pointer)0x0;
    local_428._8_8_ = (pointer)0x0;
    p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)local_2a8._M_value.super_path._M_pathname._M_dataplus._M_p + 8);
    *(undefined8 *)local_2a8._M_value.super_path._M_pathname._M_dataplus._M_p = uVar9;
    *(undefined8 *)((long)local_2a8._M_value.super_path._M_pathname._M_dataplus._M_p + 8) = uVar4;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if ((pointer)local_428._8_8_ != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428._8_8_);
    }
    local_618 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_610 = "";
    local_628 = &boost::unit_test::basic_cstring<char_const>::null;
    local_620 = &boost::unit_test::basic_cstring<char_const>::null;
    file_06.m_end = &DAT_00000068;
    file_06.m_begin = (iterator)&local_618;
    msg_06.m_end = pvVar12;
    msg_06.m_begin = pvVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_628,
               msg_06);
    SignetTxs::Create((optional<SignetTxs> *)local_428,(CBlock *)local_2f8,
                      (CScript *)&local_318.indirect_contents);
    local_640.pi_._0_1_ = local_328.super_readonly_property<bool>.super_class_property<bool>.value;
    local_638 = (element_type *)0x0;
    sStack_630.pi_ = (sp_counted_base *)0x0;
    local_650 = "SignetTxs::Create(block, challenge)";
    local_648 = "";
    local_550.m_message.px = (element_type *)((ulong)local_550.m_message.px & 0xffffffffffffff00);
    local_550._0_8_ = &PTR__lazy_ostream_013d3df0;
    local_550.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_660 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_658 = "";
    pvVar11 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    local_538 = (allocator_type *)&local_650;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_640,(lazy_ostream *)&local_550,1,0,WARN,_cVar14,
               (size_t)&local_660,0x68);
    boost::detail::shared_count::~shared_count(&sStack_630);
    if (local_328.super_readonly_property<bool>.super_class_property<bool>.value ==
        (class_property<bool>)0x1) {
      std::_Optional_payload_base<SignetTxs>::_M_destroy
                ((_Optional_payload_base<SignetTxs> *)local_428);
    }
    local_670 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_668 = "";
    local_680 = &boost::unit_test::basic_cstring<char_const>::null;
    local_678 = &boost::unit_test::basic_cstring<char_const>::null;
    file_07.m_end = (iterator)0x69;
    file_07.m_begin = (iterator)&local_670;
    msg_07.m_end = pvVar12;
    msg_07.m_begin = pvVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_680,
               msg_07);
    rVar13.super_class_property<bool>.value =
         (class_property<bool>)CheckSignetBlockSolution((CBlock *)local_2f8,(Params *)local_448);
    local_550.m_message.px = (element_type *)0x0;
    local_550.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_640.pi_ = (sp_counted_base *)0xfa51b9;
    local_638 = (element_type *)0xfa51f7;
    local_428._8_8_ = local_428._8_8_ & 0xffffffffffffff00;
    local_428._0_8_ = &PTR__lazy_ostream_013d3df0;
    local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
         boost::unit_test::lazy_ostream::inst;
    local_690 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_688 = "";
    pvVar11 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
         (assertion_result *)&local_640;
    local_550.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)rVar13.super_class_property<bool>.value;
    boost::test_tools::tt_detail::report_assertion
              (&local_550,(lazy_ostream *)local_428,1,0,WARN,_cVar14,(size_t)&local_690,0x69);
    boost::detail::shared_count::~shared_count(&local_550.m_message.pn);
    local_428[0] = (string)0x1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_5c8,local_428);
    local_428[0] = 0x51;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_5c8,
               (uchar *)local_428);
    local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
         (undefined1 *)0x0;
    local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
         (assertion_result *)0x0;
    local_428._0_8_ = (pointer)0x0;
    local_428._8_8_ = (pointer)0x0;
    local_550.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)0x6a;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_428,(iterator)local_428,
               (uchar *)&local_550);
    pCVar8 = CScript::operator<<((CScript *)local_428,
                                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_440)
    ;
    ppVar7 = &CScript::operator<<(pCVar8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &local_5c8)->super_CScriptBase;
    pCVar10 = (CMutableTransaction *)
              ((long)local_4f8.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)local_4f8.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data._M_start);
    if (pCVar10 == (CMutableTransaction *)0x0) goto LAB_0078aade;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&((local_4f8.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar7);
    if (0x1c < (uint)local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems.
                     _12_4_) {
      free((void *)local_428._0_8_);
    }
    local_428._0_8_ = (pointer)0x0;
    pCVar10 = (CMutableTransaction *)local_510;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_428 + 8),
               (CTransaction **)local_428,(allocator<CTransaction> *)&local_550,pCVar10);
    uVar4 = local_428._8_8_;
    uVar9 = local_428._0_8_;
    if ((_Alloc_hider)local_2a8._M_value.super_path._M_pathname._M_string_length ==
        local_2a8._M_value.super_path._M_pathname._M_dataplus._M_p) goto LAB_0078ab17;
    local_428._0_8_ = (pointer)0x0;
    local_428._8_8_ = (pointer)0x0;
    p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)local_2a8._M_value.super_path._M_pathname._M_dataplus._M_p + 8);
    *(undefined8 *)local_2a8._M_value.super_path._M_pathname._M_dataplus._M_p = uVar9;
    *(undefined8 *)((long)local_2a8._M_value.super_path._M_pathname._M_dataplus._M_p + 8) = uVar4;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if ((pointer)local_428._8_8_ != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428._8_8_);
    }
    local_6a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_698 = "";
    local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_6a8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_08.m_end = (iterator)0x70;
    file_08.m_begin = (iterator)&local_6a0;
    msg_08.m_end = pvVar12;
    msg_08.m_begin = pvVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_6b0,
               msg_08);
    SignetTxs::Create((optional<SignetTxs> *)local_428,(CBlock *)local_2f8,
                      (CScript *)&local_318.indirect_contents);
    local_640.pi_ =
         (sp_counted_base *)
         (CONCAT71(local_640.pi_._1_7_,
                   local_328.super_readonly_property<bool>.super_class_property<bool>.value) ^ 1);
    local_638 = (element_type *)0x0;
    sStack_630.pi_ = (sp_counted_base *)0x0;
    local_650 = "!SignetTxs::Create(block, challenge)";
    local_648 = "";
    local_550.m_message.px = (element_type *)((ulong)local_550.m_message.px & 0xffffffffffffff00);
    local_550._0_8_ = &PTR__lazy_ostream_013d3df0;
    local_550.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_6c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_6b8 = "";
    pvVar11 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    local_538 = (allocator_type *)&local_650;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_640,(lazy_ostream *)&local_550,1,0,WARN,_cVar14,
               (size_t)&local_6c0,0x70);
    boost::detail::shared_count::~shared_count(&sStack_630);
    if (local_328.super_readonly_property<bool>.super_class_property<bool>.value ==
        (class_property<bool>)0x1) {
      std::_Optional_payload_base<SignetTxs>::_M_destroy
                ((_Optional_payload_base<SignetTxs> *)local_428);
    }
    local_6d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_6c8 = "";
    local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_09.m_end = (iterator)0x71;
    file_09.m_begin = (iterator)&local_6d0;
    msg_09.m_end = pvVar12;
    msg_09.m_begin = pvVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_6e0,
               msg_09);
    bVar5 = CheckSignetBlockSolution((CBlock *)local_2f8,(Params *)local_448);
    local_550.m_message.px = (element_type *)0x0;
    local_550.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_640.pi_ = (sp_counted_base *)0xfa51b8;
    local_638 = (element_type *)0xfa51f7;
    local_428._8_8_ = local_428._8_8_ & 0xffffffffffffff00;
    local_428._0_8_ = &PTR__lazy_ostream_013d3df0;
    local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
         boost::unit_test::lazy_ostream::inst;
    local_6f0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_6e8 = "";
    pvVar11 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
         (assertion_result *)&local_640;
    local_550.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)!bVar5;
    boost::test_tools::tt_detail::report_assertion
              (&local_550,(lazy_ostream *)local_428,1,0,WARN,_cVar14,(size_t)&local_6f0,0x71);
    boost::detail::shared_count::~shared_count(&local_550.m_message.pn);
    local_428._0_8_ = local_428._0_8_ & 0xffffffffffffff00;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_5c8,
               (uchar *)local_428);
    local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
         (undefined1 *)0x0;
    local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
         (assertion_result *)0x0;
    local_428._0_8_ = (pointer)0x0;
    local_428._8_8_ = (pointer)0x0;
    local_550.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)0x6a;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_428,(iterator)local_428,
               (uchar *)&local_550);
    pCVar8 = CScript::operator<<((CScript *)local_428,
                                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_440)
    ;
    ppVar7 = &CScript::operator<<(pCVar8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &local_5c8)->super_CScriptBase;
    pCVar10 = (CMutableTransaction *)
              ((long)local_4f8.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)local_4f8.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data._M_start);
    if (pCVar10 == (CMutableTransaction *)0x0) goto LAB_0078ab40;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&((local_4f8.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar7);
    if (0x1c < (uint)local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems.
                     _12_4_) {
      free((void *)local_428._0_8_);
    }
    local_428._0_8_ = (pointer)0x0;
    pCVar10 = (CMutableTransaction *)local_510;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_428 + 8),
               (CTransaction **)local_428,(allocator<CTransaction> *)&local_550,pCVar10);
    uVar4 = local_428._8_8_;
    uVar9 = local_428._0_8_;
    if ((_Alloc_hider)local_2a8._M_value.super_path._M_pathname._M_string_length ==
        local_2a8._M_value.super_path._M_pathname._M_dataplus._M_p) goto LAB_0078ab79;
    local_428._0_8_ = (pointer)0x0;
    local_428._8_8_ = (pointer)0x0;
    p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)local_2a8._M_value.super_path._M_pathname._M_dataplus._M_p + 8);
    *(undefined8 *)local_2a8._M_value.super_path._M_pathname._M_dataplus._M_p = uVar9;
    *(undefined8 *)((long)local_2a8._M_value.super_path._M_pathname._M_dataplus._M_p + 8) = uVar4;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if ((pointer)local_428._8_8_ != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428._8_8_);
    }
    local_700 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_6f8 = "";
    local_710 = &boost::unit_test::basic_cstring<char_const>::null;
    local_708 = &boost::unit_test::basic_cstring<char_const>::null;
    file_10.m_end = (iterator)0x77;
    file_10.m_begin = (iterator)&local_700;
    msg_10.m_end = pvVar12;
    msg_10.m_begin = pvVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_710,
               msg_10);
    SignetTxs::Create((optional<SignetTxs> *)local_428,(CBlock *)local_2f8,
                      (CScript *)&local_318.indirect_contents);
    local_640.pi_._0_1_ = local_328.super_readonly_property<bool>.super_class_property<bool>.value;
    local_638 = (element_type *)0x0;
    sStack_630.pi_ = (sp_counted_base *)0x0;
    local_650 = "SignetTxs::Create(block, challenge)";
    local_648 = "";
    local_550.m_message.px = (element_type *)((ulong)local_550.m_message.px & 0xffffffffffffff00);
    local_550._0_8_ = &PTR__lazy_ostream_013d3df0;
    local_550.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_720 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_718 = "";
    pvVar11 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    local_538 = (allocator_type *)&local_650;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_640,(lazy_ostream *)&local_550,1,0,WARN,_cVar14,
               (size_t)&local_720,0x77);
    boost::detail::shared_count::~shared_count(&sStack_630);
    if (local_328.super_readonly_property<bool>.super_class_property<bool>.value ==
        (class_property<bool>)0x1) {
      std::_Optional_payload_base<SignetTxs>::_M_destroy
                ((_Optional_payload_base<SignetTxs> *)local_428);
    }
    local_730 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_728 = "";
    local_740 = &boost::unit_test::basic_cstring<char_const>::null;
    local_738 = &boost::unit_test::basic_cstring<char_const>::null;
    file_11.m_end = (iterator)0x78;
    file_11.m_begin = (iterator)&local_730;
    msg_11.m_end = pvVar12;
    msg_11.m_begin = pvVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_740,
               msg_11);
    rVar13.super_class_property<bool>.value =
         (class_property<bool>)CheckSignetBlockSolution((CBlock *)local_2f8,(Params *)local_448);
    local_550.m_message.px = (element_type *)0x0;
    local_550.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_640.pi_ = (sp_counted_base *)0xfa51b9;
    local_638 = (element_type *)0xfa51f7;
    local_428._8_8_ = local_428._8_8_ & 0xffffffffffffff00;
    local_428._0_8_ = &PTR__lazy_ostream_013d3df0;
    local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
         boost::unit_test::lazy_ostream::inst;
    local_750 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_748 = "";
    pvVar11 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
         (assertion_result *)&local_640;
    local_550.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)rVar13.super_class_property<bool>.value;
    boost::test_tools::tt_detail::report_assertion
              (&local_550,(lazy_ostream *)local_428,1,0,WARN,_cVar14,(size_t)&local_750,0x78);
    boost::detail::shared_count::~shared_count(&local_550.m_message.pn);
    local_428._0_8_ = local_428._0_8_ & 0xffffffffffffff00;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_5c8,
               (uchar *)local_428);
    local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
         (undefined1 *)0x0;
    local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
         (assertion_result *)0x0;
    local_428._0_8_ = (pointer)0x0;
    local_428._8_8_ = (pointer)0x0;
    local_550.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)0x6a;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_428,(iterator)local_428,
               (uchar *)&local_550);
    pCVar8 = CScript::operator<<((CScript *)local_428,
                                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_440)
    ;
    ppVar7 = &CScript::operator<<(pCVar8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &local_5c8)->super_CScriptBase;
    pCVar10 = (CMutableTransaction *)
              ((long)local_4f8.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)local_4f8.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data._M_start);
    if (pCVar10 == (CMutableTransaction *)0x0) goto LAB_0078aba2;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&((local_4f8.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar7);
    if (0x1c < (uint)local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems.
                     _12_4_) {
      free((void *)local_428._0_8_);
    }
    local_428._0_8_ = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_428 + 8),
               (CTransaction **)local_428,(allocator<CTransaction> *)&local_550,
               (CMutableTransaction *)local_510);
    uVar4 = local_428._8_8_;
    uVar9 = local_428._0_8_;
    if ((_Alloc_hider)local_2a8._M_value.super_path._M_pathname._M_string_length !=
        local_2a8._M_value.super_path._M_pathname._M_dataplus._M_p) {
      local_428._0_8_ = (pointer)0x0;
      local_428._8_8_ = (pointer)0x0;
      p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                ((long)local_2a8._M_value.super_path._M_pathname._M_dataplus._M_p + 8);
      *(undefined8 *)local_2a8._M_value.super_path._M_pathname._M_dataplus._M_p = uVar9;
      *(undefined8 *)((long)local_2a8._M_value.super_path._M_pathname._M_dataplus._M_p + 8) = uVar4;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      if ((pointer)local_428._8_8_ != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428._8_8_);
      }
      local_760 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
      ;
      local_758 = "";
      local_770 = &boost::unit_test::basic_cstring<char_const>::null;
      local_768 = &boost::unit_test::basic_cstring<char_const>::null;
      file_12.m_end = (iterator)0x7e;
      file_12.m_begin = (iterator)&local_760;
      msg_12.m_end = pvVar12;
      msg_12.m_begin = pvVar11;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_770,
                 msg_12);
      SignetTxs::Create((optional<SignetTxs> *)local_428,(CBlock *)local_2f8,
                        (CScript *)&local_318.indirect_contents);
      local_640.pi_ =
           (sp_counted_base *)
           (CONCAT71(local_640.pi_._1_7_,
                     local_328.super_readonly_property<bool>.super_class_property<bool>.value) ^ 1);
      local_638 = (element_type *)0x0;
      sStack_630.pi_ = (sp_counted_base *)0x0;
      local_650 = "!SignetTxs::Create(block, challenge)";
      local_648 = "";
      local_550.m_message.px = (element_type *)((ulong)local_550.m_message.px & 0xffffffffffffff00);
      local_550._0_8_ = &PTR__lazy_ostream_013d3df0;
      local_550.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_780 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
      ;
      local_778 = "";
      pvVar11 = (iterator)0x1;
      pvVar12 = (iterator)0x0;
      local_538 = (allocator_type *)&local_650;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&local_640,(lazy_ostream *)&local_550,1,0,WARN,_cVar14,
                 (size_t)&local_780,0x7e);
      boost::detail::shared_count::~shared_count(&sStack_630);
      if (local_328.super_readonly_property<bool>.super_class_property<bool>.value ==
          (class_property<bool>)0x1) {
        std::_Optional_payload_base<SignetTxs>::_M_destroy
                  ((_Optional_payload_base<SignetTxs> *)local_428);
      }
      local_790 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
      ;
      local_788 = "";
      local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_798 = &boost::unit_test::basic_cstring<char_const>::null;
      file_13.m_end = (iterator)0x7f;
      file_13.m_begin = (iterator)&local_790;
      msg_13.m_end = pvVar12;
      msg_13.m_begin = pvVar11;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_7a0,
                 msg_13);
      bVar5 = CheckSignetBlockSolution((CBlock *)local_2f8,(Params *)local_448);
      local_550.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)!bVar5;
      local_550.m_message.px = (element_type *)0x0;
      local_550.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_640.pi_ = (sp_counted_base *)0xfa51b8;
      local_638 = (element_type *)0xfa51f7;
      local_428._8_8_ = local_428._8_8_ & 0xffffffffffffff00;
      local_428._0_8_ = &PTR__lazy_ostream_013d3df0;
      local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
           boost::unit_test::lazy_ostream::inst;
      local_418[0].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
           (assertion_result *)&local_640;
      boost::test_tools::tt_detail::report_assertion
                (&local_550,(lazy_ostream *)local_428,1,0,WARN,0xfa5050,
                 (size_t)&stack0xfffffffffffff850,0x7f);
      boost::detail::shared_count::~shared_count(&local_550.m_message.pn);
      if ((pointer)local_5c8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_5c8._0_8_,(long)local_5c8.m_message.pn.pi_ - local_5c8._0_8_);
      }
      if ((char *)local_440._0_8_ != (char *)0x0) {
        operator_delete((void *)local_440._0_8_,local_440._16_8_ - local_440._0_8_);
      }
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_4f8);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_510);
      if (0x1c < local_2fc) {
        free(local_318.indirect_contents.indirect);
        local_318.indirect_contents.indirect = (char *)0x0;
      }
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 *)&local_2a8._M_value);
      std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
                ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)
                 local_448);
      ArgsManager::~ArgsManager(&local_280);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      goto LAB_0078b127;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    uVar9 = std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0
                       ,0);
    boost::detail::shared_count::~shared_count(&local_550.m_message.pn);
    if ((pointer)local_5c8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_5c8._0_8_,(long)local_5c8.m_message.pn.pi_ - local_5c8._0_8_);
    }
    if ((char *)local_440._0_8_ != (char *)0x0) {
      operator_delete((void *)local_440._0_8_,local_440._16_8_ - local_440._0_8_);
    }
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_4f8);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_510);
    if (0x1c < local_2fc) {
      free(local_318.indirect_contents.indirect);
      local_318.indirect_contents.indirect = (char *)0x0;
    }
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)&local_2a8._M_value);
    std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
              ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)local_448
              );
    ArgsManager::~ArgsManager(&local_280);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      _Unwind_Resume(uVar9);
    }
  }
LAB_0078b127:
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(signet_parse_tests)
{
    ArgsManager signet_argsman;
    signet_argsman.ForceSetArg("-signetchallenge", "51"); // set challenge to OP_TRUE
    const auto signet_params = CreateChainParams(signet_argsman, ChainType::SIGNET);
    CBlock block;
    BOOST_CHECK(signet_params->GetConsensus().signet_challenge == std::vector<uint8_t>{OP_TRUE});
    CScript challenge{OP_TRUE};

    // empty block is invalid
    BOOST_CHECK(!SignetTxs::Create(block, challenge));
    BOOST_CHECK(!CheckSignetBlockSolution(block, signet_params->GetConsensus()));

    // no witness commitment
    CMutableTransaction cb;
    cb.vout.emplace_back(0, CScript{});
    block.vtx.push_back(MakeTransactionRef(cb));
    block.vtx.push_back(MakeTransactionRef(cb)); // Add dummy tx to exercise merkle root code
    BOOST_CHECK(!SignetTxs::Create(block, challenge));
    BOOST_CHECK(!CheckSignetBlockSolution(block, signet_params->GetConsensus()));

    // no header is treated valid
    std::vector<uint8_t> witness_commitment_section_141{0xaa, 0x21, 0xa9, 0xed};
    for (int i = 0; i < 32; ++i) {
        witness_commitment_section_141.push_back(0xff);
    }
    cb.vout.at(0).scriptPubKey = CScript{} << OP_RETURN << witness_commitment_section_141;
    block.vtx.at(0) = MakeTransactionRef(cb);
    BOOST_CHECK(SignetTxs::Create(block, challenge));
    BOOST_CHECK(CheckSignetBlockSolution(block, signet_params->GetConsensus()));

    // no data after header, valid
    std::vector<uint8_t> witness_commitment_section_325{0xec, 0xc7, 0xda, 0xa2};
    cb.vout.at(0).scriptPubKey = CScript{} << OP_RETURN << witness_commitment_section_141 << witness_commitment_section_325;
    block.vtx.at(0) = MakeTransactionRef(cb);
    BOOST_CHECK(SignetTxs::Create(block, challenge));
    BOOST_CHECK(CheckSignetBlockSolution(block, signet_params->GetConsensus()));

    // Premature end of data, invalid
    witness_commitment_section_325.push_back(0x01);
    witness_commitment_section_325.push_back(0x51);
    cb.vout.at(0).scriptPubKey = CScript{} << OP_RETURN << witness_commitment_section_141 << witness_commitment_section_325;
    block.vtx.at(0) = MakeTransactionRef(cb);
    BOOST_CHECK(!SignetTxs::Create(block, challenge));
    BOOST_CHECK(!CheckSignetBlockSolution(block, signet_params->GetConsensus()));

    // has data, valid
    witness_commitment_section_325.push_back(0x00);
    cb.vout.at(0).scriptPubKey = CScript{} << OP_RETURN << witness_commitment_section_141 << witness_commitment_section_325;
    block.vtx.at(0) = MakeTransactionRef(cb);
    BOOST_CHECK(SignetTxs::Create(block, challenge));
    BOOST_CHECK(CheckSignetBlockSolution(block, signet_params->GetConsensus()));

    // Extraneous data, invalid
    witness_commitment_section_325.push_back(0x00);
    cb.vout.at(0).scriptPubKey = CScript{} << OP_RETURN << witness_commitment_section_141 << witness_commitment_section_325;
    block.vtx.at(0) = MakeTransactionRef(cb);
    BOOST_CHECK(!SignetTxs::Create(block, challenge));
    BOOST_CHECK(!CheckSignetBlockSolution(block, signet_params->GetConsensus()));
}